

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic.cpp
# Opt level: O3

Flow __thiscall Dinic::getFlow(Dinic *this,int _S,int _T)

{
  pointer pEVar1;
  pointer __s;
  pointer piVar2;
  bool bVar3;
  Edge *x;
  pointer pEVar4;
  Flow FVar5;
  Flow FVar6;
  
  this->S = _S;
  this->T = _T;
  pEVar1 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  for (pEVar4 = (this->e).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start; pEVar4 != pEVar1; pEVar4 = pEVar4 + 1) {
    pEVar4->flow = 0;
  }
  bVar3 = levels(this);
  FVar6 = 0;
  if (bVar3) {
    do {
      __s = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
      piVar2 = (this->pt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (__s != piVar2) {
        memset(__s,0,((long)piVar2 + (-4 - (long)__s) & 0xfffffffffffffffcU) + 4);
      }
      do {
        FVar5 = blocking(this,this->S,1000000000000000);
        FVar6 = FVar6 + FVar5;
      } while (FVar5 != 0);
      bVar3 = levels(this);
    } while (bVar3);
  }
  return FVar6;
}

Assistant:

Flow getFlow(int _S, int _T) {
        S = _S, T = _T;
        Flow res = 0;
        for (auto &x : e) x.flow = 0;
        while (levels()) {
            fill(pt.begin(), pt.end(), 0);
            while (ll cur = blocking(S, INF))
                res += cur;
        }
        return res;
    }